

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataQueryPdu.cpp
# Opt level: O1

void __thiscall DIS::DataQueryPdu::unmarshal(DataQueryPdu *this,DataStream *dataStream)

{
  uint *d;
  uint *d_00;
  pointer pFVar1;
  pointer pFVar2;
  pointer pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer pFVar6;
  ulong uVar7;
  FixedDatum x;
  VariableDatum local_60;
  
  SimulationManagementFamilyPdu::unmarshal(&this->super_SimulationManagementFamilyPdu,dataStream);
  DataStream::operator>>(dataStream,&this->_requestID);
  DataStream::operator>>(dataStream,&this->_timeInterval);
  d = &this->_numberOfFixedDatumRecords;
  DataStream::operator>>(dataStream,d);
  d_00 = &this->_numberOfVariableDatumRecords;
  DataStream::operator>>(dataStream,d_00);
  pFVar1 = (this->_fixedDatums).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (this->_fixedDatums).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pFVar6 = pFVar1;
  if (pFVar2 != pFVar1) {
    do {
      (**pFVar6->_vptr_FixedDatum)(pFVar6);
      pFVar6 = pFVar6 + 1;
    } while (pFVar6 != pFVar2);
    (this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
    _M_impl.super__Vector_impl_data._M_finish = pFVar1;
  }
  if (*d != 0) {
    uVar7 = 0;
    do {
      FixedDatum::FixedDatum((FixedDatum *)&local_60);
      FixedDatum::unmarshal((FixedDatum *)&local_60,dataStream);
      std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::push_back
                (&this->_fixedDatums,(value_type *)&local_60);
      FixedDatum::~FixedDatum((FixedDatum *)&local_60);
      uVar7 = uVar7 + 1;
    } while (uVar7 < *d);
  }
  pVVar3 = (this->_variableDatums).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4 = (this->_variableDatums).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar5 = pVVar3;
  if (pVVar4 != pVVar3) {
    do {
      (**pVVar5->_vptr_VariableDatum)(pVVar5);
      pVVar5 = pVVar5 + 1;
    } while (pVVar5 != pVVar4);
    (this->_variableDatums).
    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar3;
  }
  if (*d_00 != 0) {
    uVar7 = 0;
    do {
      VariableDatum::VariableDatum(&local_60);
      VariableDatum::unmarshal(&local_60,dataStream);
      std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::push_back
                (&this->_variableDatums,&local_60);
      VariableDatum::~VariableDatum(&local_60);
      uVar7 = uVar7 + 1;
    } while (uVar7 < *d_00);
  }
  return;
}

Assistant:

void DataQueryPdu::unmarshal(DataStream& dataStream)
{
    SimulationManagementFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    dataStream >> _requestID;
    dataStream >> _timeInterval;
    dataStream >> _numberOfFixedDatumRecords;
    dataStream >> _numberOfVariableDatumRecords;

     _fixedDatums.clear();
     for(size_t idx = 0; idx < _numberOfFixedDatumRecords; idx++)
     {
        FixedDatum x;
        x.unmarshal(dataStream);
        _fixedDatums.push_back(x);
     }

     _variableDatums.clear();
     for(size_t idx = 0; idx < _numberOfVariableDatumRecords; idx++)
     {
        VariableDatum x;
        x.unmarshal(dataStream);
        _variableDatums.push_back(x);
     }
}